

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_array_foreach_should_loop_over_arrays(void)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long in_FS_OFFSET;
  bool bVar5;
  long local_2a8 [80];
  long local_28;
  
  plVar3 = local_2a8;
  plVar4 = local_2a8;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_2a8,0,0x280);
  lVar1 = 9;
  plVar2 = local_2a8;
  while (bVar5 = lVar1 != 0, lVar1 = lVar1 + -1, bVar5) {
    *plVar2 = (long)(plVar2 + 8);
    plVar2[9] = (long)plVar2;
    plVar2 = plVar2 + 8;
  }
  for (; plVar3 != (undefined8 *)0x0; plVar3 = (long *)*plVar3) {
    if (plVar4 != plVar3) {
      UnityFail("Not iterating over array properly",0x37);
    }
    plVar4 = plVar4 + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_array_foreach_should_loop_over_arrays(void)
{
    cJSON array[1];
    cJSON elements[10];
    cJSON *element_pointer = NULL;
    size_t i = 0;

    memset(array, 0, sizeof(array));
    memset(elements, 0, sizeof(elements));

    /* create array */
    array[0].child = &elements[0];
    elements[0].prev = NULL;
    elements[9].next = NULL;
    for (i = 0; i < 9; i++)
    {
        elements[i].next = &elements[i + 1];
        elements[i + 1].prev = &elements[i];
    }

    i = 0;
    cJSON_ArrayForEach(element_pointer, array)
    {
        TEST_ASSERT_TRUE_MESSAGE(element_pointer == &elements[i], "Not iterating over array properly");
        i++;
    }
}